

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErfEvaluationTest.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  double dVar1;
  double dVar2;
  double __val;
  double __val_00;
  Variable x;
  UnaryExpression local_d8;
  Variable local_c0;
  string local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  Kandinsky::Variable::Variable(&local_c0);
  (local_c0.m_variableExpressionPtr.
   super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_value =
       3.0;
  Kandinsky::erf<Kandinsky::Variable,_nullptr>((ErfExpression *)&local_d8,&local_c0);
  dVar1 = Kandinsky::ErfExpression::evaluate((ErfExpression *)&local_d8);
  dVar2 = erf(3.0);
  (**((local_c0.m_variableExpressionPtr.
       super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_BaseExpression)._vptr_BaseExpression)();
  std::__cxx11::to_string(&local_88,__val);
  std::operator+(&local_68,"erf(",&local_88);
  std::operator+(&local_48,&local_68,") != ");
  __val_00 = erf(3.0);
  std::__cxx11::to_string(&local_a8,__val_00);
  std::operator+(&local_28,&local_48,&local_a8);
  Kandinsky::assertOrExit((bool)(-(dVar1 == dVar2) & 1),&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  Kandinsky::UnaryExpression::~UnaryExpression(&local_d8);
  Kandinsky::Variable::~Variable(&local_c0);
  return 0;
}

Assistant:

int main (int /*argc*/, char** /*argv*/)
{
    Variable x;
    x.setValue(3);
    assertOrExit(erf(x).evaluate() == std::erf(3), "erf(" + std::to_string(x.evaluate()) + ") != " + std::to_string(std::erf(3)));
    return 0;
}